

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_startCase(qpTestLog *log,char *testCasePath,qpTestCaseType testCaseType)

{
  char *pcVar1;
  deBool dVar2;
  deBool dVar3;
  qpXmlAttribute resultAttribs [8];
  qpXmlAttribute local_128;
  char *local_108;
  undefined4 local_100;
  char *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined4 local_e0;
  char *local_d8;
  undefined8 local_d0;
  
  pcVar1 = s_qpTestTypeMap[(int)testCaseType].string;
  deMutex_lock(log->lock);
  qpXmlWriter_flush(log->writer);
  fprintf((FILE *)log->outputFile,"\n#beginTestCaseResult %s\n",testCasePath);
  if ((log->flags & 4) == 0) {
    fflush((FILE *)log->outputFile);
  }
  log->isCaseOpen = 1;
  local_128.name = "Version";
  local_128.type = QP_XML_ATTRIBUTE_STRING;
  local_128.stringValue = "0.3.4";
  local_128.intValue = -0x2a6;
  local_128.boolValue = -1;
  local_108 = "CasePath";
  local_100 = 0;
  local_f0 = 0xfffffffffffffd5a;
  local_e8 = "CaseType";
  local_e0 = 0;
  local_d0 = 0xfffffffffffffd5a;
  local_f8 = testCasePath;
  local_d8 = pcVar1;
  dVar2 = qpXmlWriter_startDocument(log->writer);
  if (dVar2 != 0) {
    dVar2 = qpXmlWriter_startElement(log->writer,"TestCaseResult",3,&local_128);
    dVar3 = 1;
    if (dVar2 != 0) goto LAB_00a6784f;
  }
  dVar3 = 0;
  qpPrintf("qpTestLog_startCase(): Writing XML failed\n");
LAB_00a6784f:
  deMutex_unlock(log->lock);
  return dVar3;
}

Assistant:

deBool qpTestLog_startCase (qpTestLog* log, const char* testCasePath, qpTestCaseType testCaseType)
{
	const char*		typeStr				= QP_LOOKUP_STRING(s_qpTestTypeMap, testCaseType);
	int				numResultAttribs	= 0;
	qpXmlAttribute	resultAttribs[8];

	DE_ASSERT(log && testCasePath && (testCasePath[0] != 0));
	deMutex_lock(log->lock);

	DE_ASSERT(!log->isCaseOpen);
	DE_ASSERT(ContainerStack_isEmpty(&log->containerStack));

	/* Flush XML and write out #beginTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#beginTestCaseResult %s\n", testCasePath);
	if (!(log->flags & QP_TEST_LOG_NO_FLUSH))
		qpTestLog_flushFile(log);

	log->isCaseOpen = DE_TRUE;

	/* Fill in attributes. */
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("Version", LOG_FORMAT_VERSION);
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("CasePath", testCasePath);
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("CaseType", typeStr);

	if (!qpXmlWriter_startDocument(log->writer) ||
		!qpXmlWriter_startElement(log->writer, "TestCaseResult", numResultAttribs, resultAttribs))
	{
		qpPrintf("qpTestLog_startCase(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}